

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::handleSelectionAttributes
          (TParseContext *this,TAttributes *attributes,TIntermNode *node)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  pointer pTVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  _Self local_38;
  _Self local_30;
  const_iterator it;
  TIntermSelection *selection;
  TIntermNode *node_local;
  TAttributes *attributes_local;
  TParseContext *this_local;
  
  iVar2 = (*node->_vptr_TIntermNode[9])();
  it._M_node = (_List_node_base *)CONCAT44(extraout_var,iVar2);
  if (it._M_node != (_List_node_base *)0x0) {
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>::begin
                   (&attributes->
                     super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                   );
    while( true ) {
      local_38._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>::end
                     (&attributes->
                       super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                     );
      bVar1 = std::operator!=(&local_30,&local_38);
      if (!bVar1) break;
      pTVar3 = std::_List_const_iterator<glslang::TAttributeArgs>::operator->(&local_30);
      iVar2 = TAttributeArgs::size(pTVar3);
      if (iVar2 < 1) {
        pTVar3 = std::_List_const_iterator<glslang::TAttributeArgs>::operator->(&local_30);
        if (pTVar3->name == EatBranch) {
          TIntermSelection::setDontFlatten((TIntermSelection *)it._M_node);
        }
        else if (pTVar3->name == EatFlatten) {
          TIntermSelection::setFlatten((TIntermSelection *)it._M_node);
        }
        else {
          iVar2 = (**node->_vptr_TIntermNode)();
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                    (this,CONCAT44(extraout_var_01,iVar2),"attribute does not apply to a selection",
                     "");
        }
      }
      else {
        iVar2 = (**node->_vptr_TIntermNode)();
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                  (this,CONCAT44(extraout_var_00,iVar2),
                   "attribute with arguments not recognized, skipping","");
      }
      std::_List_const_iterator<glslang::TAttributeArgs>::operator++(&local_30);
    }
  }
  return;
}

Assistant:

void TParseContext::handleSelectionAttributes(const TAttributes& attributes, TIntermNode* node)
{
    TIntermSelection* selection = node->getAsSelectionNode();
    if (selection == nullptr)
        return;

    for (auto it = attributes.begin(); it != attributes.end(); ++it) {
        if (it->size() > 0) {
            warn(node->getLoc(), "attribute with arguments not recognized, skipping", "", "");
            continue;
        }

        switch (it->name) {
        case EatFlatten:
            selection->setFlatten();
            break;
        case EatBranch:
            selection->setDontFlatten();
            break;
        default:
            warn(node->getLoc(), "attribute does not apply to a selection", "", "");
            break;
        }
    }
}